

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O0

CharMapper<unsigned_char> * gmlc::utilities::digitMapper(void)

{
  CharMapper<unsigned_char> *in_RDI;
  uchar indexChar;
  uchar val;
  uchar defVal;
  CharMapper<unsigned_char> *this;
  undefined1 local_2;
  
  defVal = (uchar)((ulong)in_RDI >> 0x38);
  this = in_RDI;
  CharMapper<unsigned_char>::CharMapper(in_RDI,defVal);
  for (local_2 = 0x30; local_2 < 0x3a; local_2 = local_2 + 1) {
    CharMapper<unsigned_char>::addKey(this,defVal,(uchar)((ulong)in_RDI >> 0x30));
  }
  return this;
}

Assistant:

CharMapper<unsigned char> digitMapper()
{
    CharMapper<unsigned char> dMap(0xFF);
    unsigned char val = 0;
    for (unsigned char indexChar = '0'; indexChar <= '9'; ++indexChar) {
        dMap.addKey(indexChar, val);
        ++val;
    }
    return dMap;
}